

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::replaceWithLogicalBasis(HModel *this)

{
  reference pvVar1;
  HModel *in_RDI;
  int col;
  int var;
  int row;
  int in_stack_ffffffffffffffdc;
  int local_14;
  int local_c;
  
  for (local_c = 0; local_c < in_RDI->numRow; local_c = local_c + 1) {
    in_stack_ffffffffffffffdc = in_RDI->numCol + local_c;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->nonbasicFlag,(long)in_stack_ffffffffffffffdc);
    *pvVar1 = 0;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->basicIndex,(long)local_c);
    *pvVar1 = in_stack_ffffffffffffffdc;
  }
  for (local_14 = 0; local_14 < in_RDI->numCol; local_14 = local_14 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->nonbasicFlag,(long)local_14);
    *pvVar1 = 1;
  }
  in_RDI->numBasicLogicals = in_RDI->numRow;
  populate_WorkArrays(in_RDI);
  mlFg_Update(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void HModel::replaceWithLogicalBasis() {
  // Replace basis with a logical basis then populate (where possible)
  // work* arrays
  for (int row = 0; row < numRow; row++) {
    int var = numCol + row;
    nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
    basicIndex[row] = var;
  }
  for (int col = 0; col < numCol; col++) {
    nonbasicFlag[col] = NONBASIC_FLAG_TRUE;
  }
  numBasicLogicals = numRow;

  populate_WorkArrays();

  //Deduce the consequences of a new basis
  mlFg_Update(mlFg_action_NewBasis);
}